

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * Catch::clara::detail::convertInto(string *source,bool *target)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *in_RDX;
  string *in_RSI;
  ParserResult *in_RDI;
  string srcLC;
  ParserResult *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 *local_18;
  
  __lhs_00 = &local_38;
  __lhs = in_RDI;
  local_18 = in_RDX;
  ::std::__cxx11::string::string((string *)__lhs_00,in_RSI);
  uVar2 = ::std::__cxx11::string::begin();
  uVar3 = ::std::__cxx11::string::end();
  uVar4 = ::std::__cxx11::string::begin();
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,Catch::clara::detail::convertInto(std::__cxx11::string_const&,bool&)::_lambda(unsigned_char)_1_>
            (uVar2,uVar3,uVar4);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(char *)in_RDI);
  if (bVar1) {
LAB_002c37d3:
    *local_18 = 1;
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(char *)in_RDI);
    if (bVar1) goto LAB_002c37d3;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(char *)in_RDI);
    if (bVar1) goto LAB_002c37d3;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(char *)in_RDI);
    if (bVar1) goto LAB_002c37d3;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(char *)in_RDI);
    if (bVar1) goto LAB_002c37d3;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(char *)in_RDI);
    if (!bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,(char *)in_RDI);
      if (!bVar1) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,(char *)in_RDI);
        if (!bVar1) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,(char *)in_RDI);
          if (!bVar1) {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,(char *)in_RDI);
            if (!bVar1) {
              ::std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              ::std::operator+(__lhs_00,(char *)__lhs);
              BasicResult<Catch::clara::detail::ParseResultType>::runtimeError((string *)in_RDI);
              ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
              ::std::__cxx11::string::~string(local_b0);
              goto LAB_002c3937;
            }
          }
        }
      }
    }
    *local_18 = 0;
  }
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            ((ParseResultType *)in_RDI);
LAB_002c3937:
  ::std::__cxx11::string::~string((string *)&local_38);
  return __lhs;
}

Assistant:

inline auto convertInto( std::string const &source, bool &target ) -> ParserResult {
        std::string srcLC = source;
        std::transform( srcLC.begin(), srcLC.end(), srcLC.begin(), []( unsigned char c ) { return static_cast<char>( std::tolower(c) ); } );
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
            target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
            target = false;
        else
            return ParserResult::runtimeError( "Expected a boolean value but did not recognise: '" + source + "'" );
        return ParserResult::ok( ParseResultType::Matched );
    }